

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

SockAddr * platform_get_x11_unix_address(char *sockpath,int displaynum)

{
  uint uVar1;
  SockAddr *__s;
  char *pcVar2;
  
  __s = (SockAddr *)safemalloc(1,0x220,0);
  memset(__s,0,0x220);
  __s->superfamily = UNIX;
  if (sockpath == (char *)0x0) {
    uVar1 = snprintf(__s->hostname,0x200,"%s%d","/tmp/.X11-unix/X",displaynum);
  }
  else {
    uVar1 = snprintf(__s->hostname,0x200,"%s",sockpath);
  }
  if ((int)uVar1 < 0) {
    pcVar2 = "snprintf failed";
  }
  else {
    if (uVar1 < 0x200) goto LAB_0013de46;
    pcVar2 = "X11 UNIX name too long";
  }
  __s->error = pcVar2;
LAB_0013de46:
  __s->ais = (addrinfo *)0x0;
  __s->refcount = 1;
  return __s;
}

Assistant:

SockAddr *platform_get_x11_unix_address(const char *sockpath, int displaynum)
{
    SockAddr *ret = snew(SockAddr);
    int n;

    memset(ret, 0, sizeof *ret);
    ret->superfamily = UNIX;
    /*
     * In special circumstances (notably Mac OS X Leopard), we'll
     * have been passed an explicit Unix socket path.
     */
    if (sockpath) {
        n = snprintf(ret->hostname, sizeof ret->hostname,
                     "%s", sockpath);
    } else {
        n = snprintf(ret->hostname, sizeof ret->hostname,
                     "%s%d", X11_UNIX_PATH, displaynum);
    }

    if (n < 0)
        ret->error = "snprintf failed";
    else if (n >= sizeof ret->hostname)
        ret->error = "X11 UNIX name too long";

#ifndef NO_IPV6
    ret->ais = NULL;
#else
    ret->addresses = NULL;
    ret->naddresses = 0;
#endif
    ret->refcount = 1;
    return ret;
}